

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O1

Abc_Ntk_t *
Abc_FlowRetime_MinReg
          (Abc_Ntk_t *pNtk,int fVerbose,int fComputeInitState,int fGuaranteeInitState,
          int fBlockConst,int fForwardOnly,int fBackwardOnly,int nMaxIters,int maxDelay,
          int fFastButConservative)

{
  Abc_NtkType_t AVar1;
  long *plVar2;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  void *pvVar5;
  long lVar6;
  size_t __size;
  uint uVar7;
  int iVar8;
  int iVar9;
  MinRegMan_t *pMVar10;
  Vec_Ptr_t *pVVar11;
  void **ppvVar12;
  long lVar13;
  Abc_Obj_t *pAVar14;
  Vec_Int_t *pVVar15;
  int *piVar16;
  Flow_Data_t *__s;
  Abc_Ntk_t *pNtk_00;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  long lVar22;
  int iVar23;
  
  pMVar10 = (MinRegMan_t *)malloc(0xb0);
  pManMR = pMVar10;
  pMVar10->pNtk = pNtk;
  pMVar10->fVerbose = fVerbose;
  pMVar10->fComputeInitState = fComputeInitState;
  pMVar10->fGuaranteeInitState = fGuaranteeInitState;
  pMVar10->fBlockConst = fBlockConst;
  pMVar10->fForwardOnly = fForwardOnly;
  pMVar10->fBackwardOnly = fBackwardOnly;
  pMVar10->nMaxIters = nMaxIters;
  pMVar10->maxDelay = maxDelay;
  pMVar10->fConservTimingOnly = fFastButConservative;
  pVVar11 = (Vec_Ptr_t *)malloc(0x10);
  pVVar11->nCap = 100;
  pVVar11->nSize = 0;
  ppvVar12 = (void **)malloc(800);
  pVVar11->pArray = ppvVar12;
  pMVar10->vNodes = pVVar11;
  pVVar11 = (Vec_Ptr_t *)malloc(0x10);
  pVVar11->nCap = 8;
  pVVar11->nSize = 0;
  ppvVar12 = (void **)malloc(0x40);
  pVVar11->pArray = ppvVar12;
  pMVar10->vInitConstraints = pVVar11;
  pMVar10->pInitNtk = (Abc_Ntk_t *)0x0;
  pMVar10->pInitToOrig = (NodeLag_t *)0x0;
  pMVar10->sizeInitToOrig = 0;
  if (fVerbose != 0) {
    puts("Flow-based minimum-register retiming...");
  }
  if (pNtk->nObjCounts[8] != pNtk->vBoxes->nSize) {
    puts("\tERROR: Can not retime with black/white boxes");
    return pNtk;
  }
  if (maxDelay != 0) {
    if (pManMR->fVerbose != 0) {
      printf("\tmax delay constraint = %d\n");
    }
    uVar7 = Abc_NtkLevel(pNtk);
    if (maxDelay < (int)uVar7) {
      printf("ERROR: max delay constraint (%d) must be > current max delay (%d)\n",
             (ulong)(uint)maxDelay,(ulong)uVar7);
      return pNtk;
    }
  }
  if (pManMR->fVerbose != 0) {
    printf("\tnetlist type = ");
  }
  AVar1 = pNtk->ntkType;
  iVar9 = pManMR->fVerbose;
  if (AVar1 == ABC_NTK_STRASH) {
    if (iVar9 != 0) {
      pcVar21 = "strash/";
      goto LAB_00473c2c;
    }
  }
  else if (AVar1 == ABC_NTK_LOGIC) {
    if (iVar9 != 0) {
      pcVar21 = "logic/";
      goto LAB_00473c2c;
    }
  }
  else if (AVar1 == ABC_NTK_NETLIST) {
    if (iVar9 != 0) {
      pcVar21 = "netlist/";
LAB_00473c2c:
      printf(pcVar21);
    }
  }
  else if (iVar9 != 0) {
    pcVar21 = "***unknown***/";
    goto LAB_00473c2c;
  }
  iVar9 = pManMR->fVerbose;
  switch(pNtk->ntkFunc) {
  case ABC_FUNC_SOP:
    if (iVar9 != 0) {
      pcVar21 = "sop";
LAB_00473c96:
      puts(pcVar21);
    }
    break;
  case ABC_FUNC_BDD:
    if (iVar9 != 0) {
      pcVar21 = "bdd";
      goto LAB_00473c96;
    }
    break;
  case ABC_FUNC_AIG:
    if (iVar9 != 0) {
      pcVar21 = "aig";
      goto LAB_00473c96;
    }
    break;
  case ABC_FUNC_MAP:
    if (iVar9 != 0) {
      pcVar21 = "mapped";
      goto LAB_00473c96;
    }
    break;
  default:
    if (iVar9 != 0) {
      pcVar21 = "***unknown***";
      goto LAB_00473c96;
    }
  }
  if (pManMR->fVerbose != 0) {
    printf("\tinitial reg count = %d\n");
  }
  if (pManMR->fVerbose != 0) {
    Abc_NtkLevel(pNtk);
    printf("\tinitial levels = %d\n");
  }
  if (pManMR->fVerbose != 0) {
    Abc_FlowRetime_PrintInitStateInfo(pNtk);
  }
  if (pManMR->fVerbose != 0) {
    puts("\tpushing bubbles out of latch boxes");
  }
  pVVar11 = pNtk->vBoxes;
  if (0 < pVVar11->nSize) {
    lVar22 = 0;
    do {
      plVar2 = (long *)pVVar11->pArray[lVar22];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
        lVar13 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
        pAVar3 = *(Abc_Obj_t **)(lVar13 + (long)*(int *)plVar2[4] * 8);
        if (((ulong)pAVar3 & 1) != 0) {
          __assert_fail("!Abc_ObjIsComplement(pBi)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x17b,"void Abc_FlowRetime_RemoveLatchBubbles(Abc_Obj_t *)");
        }
        uVar19 = *(ulong *)(lVar13 + (long)*(int *)plVar2[6] * 8);
        if ((uVar19 & 1) != 0) {
          __assert_fail("!Abc_ObjIsComplement(pBo)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x17c,"void Abc_FlowRetime_RemoveLatchBubbles(Abc_Obj_t *)");
        }
        pAVar4 = pManMR->pNtk;
        uVar7 = 0;
        if (((*(byte *)(uVar19 + 0x15) & 4) != 0) && (uVar7 = 0, 0 < *(int *)(uVar19 + 0x2c))) {
          uVar7 = 0x400;
          if (plVar2[7] == 1) {
            lVar13 = 2;
          }
          else {
            if (plVar2[7] != 2) goto LAB_00473dc1;
            lVar13 = 1;
          }
          plVar2[7] = lVar13;
        }
LAB_00473dc1:
        uVar7 = *(uint *)((long)plVar2 + 0x14) & 0x400 ^ uVar7;
        uVar18 = *(uint *)&pAVar3->field_0x14 & 0x400;
        uVar17 = *(uint *)&pAVar3->field_0x14 & 0xfffffbff;
        *(uint *)&pAVar3->field_0x14 = uVar18 ^ uVar7 | uVar17;
        if ((pAVar4->ntkType != ABC_NTK_STRASH) && (uVar18 != uVar7)) {
          *(uint *)&pAVar3->field_0x14 = uVar17;
          pAVar14 = Abc_NtkCreateNodeInv
                              (pAVar4,(Abc_Obj_t *)
                                      pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray]);
          Abc_ObjPatchFanin(pAVar3,(Abc_Obj_t *)
                                   pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray],pAVar14);
        }
        *(byte *)(uVar19 + 0x15) = *(byte *)(uVar19 + 0x15) & 0xfb;
        *(byte *)((long)plVar2 + 0x15) = *(byte *)((long)plVar2 + 0x15) & 0xfb;
      }
      lVar22 = lVar22 + 1;
      pVVar11 = pNtk->vBoxes;
    } while (lVar22 < pVVar11->nSize);
  }
  if (pManMR->fVerbose != 0) {
    Abc_FlowRetime_PrintInitStateInfo(pNtk);
  }
  pVVar11 = pNtk->vBoxes;
  if (0 < pVVar11->nSize) {
    lVar22 = 0;
    do {
      plVar2 = (long *)pVVar11->pArray[lVar22];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
        if (*(int *)((long)plVar2 + 0x1c) != 1) {
          __assert_fail("Abc_ObjFaninNum(pObj) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x8c,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        if (*(int *)((long)plVar2 + 0x2c) != 1) {
          __assert_fail("Abc_ObjFanoutNum(pObj) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x8d,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        if ((*(uint *)((long)plVar2 + 0x14) >> 10 & 1) != 0) {
          __assert_fail("!Abc_ObjFaninC0(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x8e,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        pAVar3 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
        if ((*(uint *)&pAVar3->field_0x14 & 0xf) != 4) {
          __assert_fail("Abc_ObjIsBi(pNext)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x91,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        iVar9 = (pAVar3->vFanins).nSize;
        if (1 < iVar9) {
          __assert_fail("Abc_ObjFaninNum(pNext) <= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x92,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        if (iVar9 == 0) {
          pAVar4 = pAVar3->pNtk;
          if (pAVar4->ntkType == ABC_NTK_STRASH) {
            pAVar14 = Abc_AigConst1(pAVar4);
          }
          else {
            pAVar14 = Abc_NtkCreateNodeConst0(pAVar4);
          }
          Abc_ObjAddFanin(pAVar3,pAVar14);
        }
        lVar13 = *(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8);
        uVar7 = *(uint *)(lVar13 + 0x14);
        if ((uVar7 & 0xf) != 5) {
          __assert_fail("Abc_ObjIsBo(pNext)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x97,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        if (*(int *)(lVar13 + 0x1c) != 1) {
          __assert_fail("Abc_ObjFaninNum(pNext) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x98,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        if ((uVar7 >> 10 & 1) != 0) {
          __assert_fail("!Abc_ObjFaninC0(pNext)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x99,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
      }
      lVar22 = lVar22 + 1;
      pVVar11 = pNtk->vBoxes;
    } while (lVar22 < pVVar11->nSize);
  }
  pMVar10 = pManMR;
  pManMR->nLatches = pNtk->nObjCounts[8];
  iVar9 = pNtk->vObjs->nSize;
  pMVar10->nNodes = iVar9 + 1;
  lVar22 = (long)iVar9 * 2 + 0xc;
  pVVar15 = (Vec_Int_t *)malloc(0x10);
  iVar23 = (int)lVar22;
  iVar8 = 0x10;
  if (0xe < iVar9 * 2 + 0xbU) {
    iVar8 = iVar23;
  }
  pVVar15->nSize = 0;
  pVVar15->nCap = iVar8;
  if (iVar8 == 0) {
    piVar16 = (int *)0x0;
  }
  else {
    piVar16 = (int *)malloc((long)iVar8 << 2);
  }
  pVVar15->pArray = piVar16;
  pVVar15->nSize = iVar23;
  memset(piVar16,0,lVar22 * 4);
  pMVar10->vSinkDistHist = pVVar15;
  if (maxDelay != 0) {
    Abc_FlowRetime_InitTiming(pNtk);
  }
  pMVar10 = pManMR;
  iVar9 = pManMR->nNodes;
  pVVar15 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar8 = iVar9;
  }
  pVVar15->nSize = 0;
  pVVar15->nCap = iVar8;
  if (iVar8 == 0) {
    piVar16 = (int *)0x0;
  }
  else {
    piVar16 = (int *)malloc((long)iVar8 << 2);
  }
  pVVar15->pArray = piVar16;
  pVVar15->nSize = iVar9;
  memset(piVar16,0,(long)iVar9 << 2);
  pMVar10->vLags = pVVar15;
  memset(piVar16,0,(long)pMVar10->nNodes << 2);
  __size = (long)pMVar10->nNodes * 0x18;
  __s = (Flow_Data_t *)malloc(__size);
  pMVar10->pDataArray = __s;
  memset(__s,0,__size);
  pAVar4 = pMVar10->pNtk;
  pMVar10->fIsForward = 1;
  pMVar10->iteration = 0;
  if (pMVar10->fBackwardOnly == 0) {
    do {
      pMVar10 = pManMR;
      if (pManMR->iteration == pManMR->nMaxIters) break;
      pManMR->subIteration = 0;
      if (pMVar10->fVerbose != 0) {
        printf("\tforward iteration %d\n");
      }
      iVar9 = pAVar4->nObjCounts[8];
      Abc_FlowRetime_MarkBlocks(pAVar4);
      if (pManMR->maxDelay == 0) {
        Abc_FlowRetime_PushFlows(pAVar4,1);
      }
      else {
        Abc_FlowRetime_ConstrainConserv(pAVar4);
        while (iVar8 = Abc_FlowRetime_RefineConstraints(), iVar8 != 0) {
          pManMR->subIteration = pManMR->subIteration + 1;
          Abc_FlowRetime_ClearFlows(0);
        }
      }
      iVar8 = Abc_FlowRetime_ImplementCut(pAVar4);
      memset(pManMR->pDataArray,0,(long)pManMR->nNodes * 0x18);
      pManMR->iteration = pManMR->iteration + 1;
    } while (iVar8 != iVar9);
  }
  pNtk_00 = pAVar4;
  if (pAVar4->ntkType == ABC_NTK_STRASH) {
    Abc_NtkReassignIds(pAVar4);
    pNtk_00 = Abc_FlowRetime_NtkSilentRestrash(pAVar4,1);
    pManMR->pNtk = pNtk_00;
  }
  if ((pManMR->fComputeInitState != 0) && (pManMR->fVerbose != 0)) {
    Abc_FlowRetime_PrintInitStateInfo(pNtk_00);
  }
  pMVar10 = pManMR;
  pManMR->fIsForward = 0;
  if (pMVar10->fForwardOnly == 0) {
    do {
      pMVar10 = pManMR;
      pManMR->iteration = 0;
      if (pMVar10->fGuaranteeInitState != 0) {
        if (pNtk_00 != pAVar4) {
          Abc_NtkDelete(pNtk_00);
        }
        pNtk_00 = Abc_NtkAlloc(pAVar4->ntkType,pAVar4->ntkFunc,1);
        pcVar21 = Extra_UtilStrsav(pAVar4->pName);
        pNtk_00->pName = pcVar21;
        pcVar21 = Extra_UtilStrsav(pAVar4->pSpec);
        pNtk_00->pSpec = pcVar21;
        pVVar11 = pAVar4->vObjs;
        if (0 < pVVar11->nSize) {
          lVar22 = 0;
          do {
            pAVar3 = (Abc_Obj_t *)pVVar11->pArray[lVar22];
            if (pAVar3 != (Abc_Obj_t *)0x0) {
              if (pAVar4->ntkType == ABC_NTK_STRASH) {
                if (**(int **)((ulong)pAVar3 & 0xfffffffffffffffe) != 3) {
                  __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                                ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
                }
                if ((*(uint *)((long)((ulong)pAVar3 & 0xfffffffffffffffe) + 0x14) & 0xf) != 1)
                goto LAB_004744e8;
                pAVar14 = Abc_AigConst1(pNtk_00);
              }
              else {
LAB_004744e8:
                pAVar14 = Abc_NtkDupObj(pNtk_00,pAVar3,0);
              }
              pManMR->pDataArray[(uint)pAVar3->Id].field_1.pred = pAVar14;
              *(undefined2 *)(pManMR->pDataArray + (uint)pAVar3->Id) = 0;
              uVar17 = *(uint *)&pAVar3->field_0x14 & 0x400;
              uVar7 = *(uint *)&pAVar14->field_0x14;
              *(uint *)&pAVar14->field_0x14 = uVar7 & 0xfffffbff | uVar17;
              uVar18 = *(uint *)&pAVar3->field_0x14 & 0x800;
              *(uint *)&pAVar14->field_0x14 = uVar7 & 0xfffff3ff | uVar17 | uVar18;
              *(uint *)&pAVar14->field_0x14 =
                   uVar7 & 0xfffff37f | uVar17 | uVar18 | *(uint *)&pAVar3->field_0x14 & 0x80;
            }
            lVar22 = lVar22 + 1;
            pVVar11 = pAVar4->vObjs;
          } while (lVar22 < pVVar11->nSize);
        }
        pVVar11 = pAVar4->vObjs;
        uVar19 = (ulong)(uint)pVVar11->nSize;
        if (0 < pVVar11->nSize) {
          lVar22 = 0;
          do {
            plVar2 = (long *)pVVar11->pArray[lVar22];
            if (plVar2 != (long *)0x0) {
              pAVar3 = pManMR->pDataArray[*(uint *)(plVar2 + 2)].field_1.pred;
              if (pAVar3 == (Abc_Obj_t *)0x0) {
                __assert_fail("pObjCopy",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                              ,0x47a,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
              }
              if (0 < *(int *)((long)plVar2 + 0x1c)) {
                lVar13 = 0;
                do {
                  lVar6 = *(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                   (long)*(int *)(plVar2[4] + lVar13 * 4) * 8);
                  pAVar14 = pManMR->pDataArray[*(uint *)(lVar6 + 0x10)].field_1.pred;
                  if (pAVar14 == (Abc_Obj_t *)0x0) {
                    __assert_fail("pNextCopy",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                                  ,0x47d,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
                  }
                  if (((*(uint *)&pAVar14->field_0x14 ^ *(uint *)(lVar6 + 0x14)) & 0xf) != 0) {
                    __assert_fail("pNext->Type == pNextCopy->Type",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                                  ,0x47e,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
                  }
                  Abc_ObjAddFanin(pAVar3,pAVar14);
                  lVar13 = lVar13 + 1;
                } while (lVar13 < *(int *)((long)plVar2 + 0x1c));
              }
            }
            lVar22 = lVar22 + 1;
            pVVar11 = pAVar4->vObjs;
            uVar19 = (ulong)pVVar11->nSize;
          } while (lVar22 < (long)uVar19);
        }
        pMVar10 = pManMR;
        if (0 < (int)uVar19) {
          uVar20 = 0;
          do {
            pvVar5 = pVVar11->pArray[uVar20];
            if (pvVar5 != (void *)0x0) {
              pAVar3 = pManMR->pDataArray[*(uint *)((long)pvVar5 + 0x10)].field_1.pred;
              if (*(int *)((long)pvVar5 + 0x2c) != (pAVar3->vFanouts).nSize) {
                __assert_fail("Abc_ObjFanoutNum( pObj ) == Abc_ObjFanoutNum( pObjCopy )",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                              ,0x487,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
              }
              if (*(int *)((long)pvVar5 + 0x1c) != (pAVar3->vFanins).nSize) {
                __assert_fail("Abc_ObjFaninNum( pObj ) == Abc_ObjFaninNum( pObjCopy )",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                              ,0x488,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
              }
            }
            uVar20 = uVar20 + 1;
          } while ((uVar19 & 0xffffffff) != uVar20);
        }
        if (pAVar4->nObjs != pNtk_00->nObjs) {
          __assert_fail("Abc_NtkObjNum( pNtk ) == Abc_NtkObjNum( pNtkCopy )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x48c,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
        }
        if (pAVar4->nObjCounts[8] != pNtk_00->nObjCounts[8]) {
          __assert_fail("Abc_NtkLatchNum( pNtk ) == Abc_NtkLatchNum( pNtkCopy )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x48d,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
        }
        if (pAVar4->vPos->nSize != pNtk_00->vPos->nSize) {
          __assert_fail("Abc_NtkPoNum( pNtk ) == Abc_NtkPoNum( pNtkCopy )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x48e,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
        }
        if (pAVar4->vPis->nSize != pNtk_00->vPis->nSize) {
          __assert_fail("Abc_NtkPiNum( pNtk ) == Abc_NtkPiNum( pNtkCopy )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x48f,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
        }
        pManMR->pNtk = pNtk_00;
        if (pMVar10->fVerbose != 0) {
          printf("\trestoring network. regs = %d\n");
        }
      }
      if (pManMR->fComputeInitState != 0) {
        Abc_FlowRetime_SetupBackwardInit(pNtk_00);
      }
      do {
        pMVar10 = pManMR;
        if (pManMR->iteration == pManMR->nMaxIters) break;
        pManMR->subIteration = 0;
        if (pMVar10->fVerbose != 0) {
          printf("\tbackward iteration %d\n");
        }
        iVar9 = pNtk_00->nObjCounts[8];
        Abc_FlowRetime_AddInitBias();
        Abc_FlowRetime_MarkBlocks(pNtk_00);
        if (pManMR->maxDelay == 0) {
          Abc_FlowRetime_PushFlows(pNtk_00,1);
        }
        else {
          Abc_FlowRetime_ConstrainConserv(pNtk_00);
          while (iVar8 = Abc_FlowRetime_RefineConstraints(), iVar8 != 0) {
            pManMR->subIteration = pManMR->subIteration + 1;
            Abc_FlowRetime_ClearFlows(0);
          }
        }
        Abc_FlowRetime_RemoveInitBias();
        iVar8 = Abc_FlowRetime_ImplementCut(pNtk_00);
        memset(pManMR->pDataArray,0,(long)pManMR->nNodes * 0x18);
        pManMR->iteration = pManMR->iteration + 1;
      } while (iVar8 != iVar9);
      if (pManMR->fComputeInitState == 0) break;
      iVar9 = Abc_FlowRetime_SolveBackwardInit(pNtk_00);
      if (iVar9 != 0) {
        if (pManMR->fVerbose != 0) {
          Abc_FlowRetime_PrintInitStateInfo(pNtk_00);
        }
        break;
      }
      if (pManMR->fGuaranteeInitState == 0) goto LAB_00474851;
      Abc_FlowRetime_ConstrainInit();
      Abc_NtkDelete(pManMR->pInitNtk);
      pManMR->pInitNtk = (Abc_Ntk_t *)0x0;
    } while( true );
  }
LAB_004741d3:
  if (pManMR->fComputeInitState != 0) {
    Abc_NtkDelete(pManMR->pInitNtk);
  }
  pVVar11 = pNtk_00->vObjs;
  if (0 < pVVar11->nSize) {
    lVar22 = 0;
    do {
      if (((fComputeInitState == 0) && (pvVar5 = pVVar11->pArray[lVar22], pvVar5 != (void *)0x0)) &&
         ((*(uint *)((long)pvVar5 + 0x14) & 0xf) == 8)) {
        *(undefined8 *)((long)pvVar5 + 0x38) = 3;
      }
      lVar22 = lVar22 + 1;
      pVVar11 = pNtk_00->vObjs;
    } while (lVar22 < pVVar11->nSize);
  }
  if (pManMR->pDataArray != (Flow_Data_t *)0x0) {
    free(pManMR->pDataArray);
    pManMR->pDataArray = (Flow_Data_t *)0x0;
  }
  if (pManMR->pInitToOrig != (NodeLag_t *)0x0) {
    free(pManMR->pInitToOrig);
    pManMR->pInitToOrig = (NodeLag_t *)0x0;
  }
  pVVar11 = pManMR->vNodes;
  if (pVVar11 != (Vec_Ptr_t *)0x0) {
    if (pVVar11->pArray != (void **)0x0) {
      free(pVVar11->pArray);
      pVVar11->pArray = (void **)0x0;
    }
    free(pVVar11);
  }
  pVVar15 = pManMR->vLags;
  if (pVVar15 != (Vec_Int_t *)0x0) {
    if (pVVar15->pArray != (int *)0x0) {
      free(pVVar15->pArray);
      pVVar15->pArray = (int *)0x0;
    }
    free(pVVar15);
  }
  pVVar15 = pManMR->vSinkDistHist;
  if (pVVar15 != (Vec_Int_t *)0x0) {
    if (pVVar15->pArray != (int *)0x0) {
      free(pVVar15->pArray);
      pVVar15->pArray = (int *)0x0;
    }
    free(pVVar15);
  }
  if (pManMR->maxDelay != 0) {
    Abc_FlowRetime_FreeTiming(pNtk_00);
  }
  pVVar11 = pManMR->vInitConstraints;
  iVar9 = pVVar11->nSize;
  while( true ) {
    if (iVar9 == 0) {
      if (pVVar11 != (Vec_Ptr_t *)0x0) {
        free(pVVar11);
        pManMR->vInitConstraints = (Vec_Ptr_t *)0x0;
      }
      if (pNtk_00->ntkType == ABC_NTK_STRASH) {
        Abc_NtkReassignIds(pNtk_00);
        pNtk_00 = Abc_FlowRetime_NtkSilentRestrash(pNtk_00,1);
      }
      if (pManMR->fVerbose != 0) {
        printf("\tfinal reg count = %d\n",(ulong)(uint)pNtk_00->nObjCounts[8]);
      }
      if (pManMR->fVerbose != 0) {
        uVar7 = Abc_NtkLevel(pNtk_00);
        printf("\tfinal levels = %d\n",(ulong)uVar7);
      }
      Abc_NtkDoCheck(pNtk_00);
      if (pManMR != (MinRegMan_t *)0x0) {
        free(pManMR);
        pManMR = (MinRegMan_t *)0x0;
      }
      return pNtk_00;
    }
    if (iVar9 < 1) break;
    pVVar11->nSize = iVar9 - 1U;
    pvVar5 = pVVar11->pArray[iVar9 - 1U];
    if (*(void **)((long)pvVar5 + 0x10) != (void *)0x0) {
      free(*(void **)((long)pvVar5 + 0x10));
      *(undefined8 *)((long)pvVar5 + 0x10) = 0;
    }
    if (pvVar5 != (void *)0x0) {
      free(pvVar5);
    }
    pVVar11 = pManMR->vInitConstraints;
    iVar9 = pVVar11->nSize;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
LAB_00474851:
  puts("WARNING: no equivalent init state. setting all initial states to don\'t-cares");
  pVVar11 = pNtk_00->vBoxes;
  if (0 < pVVar11->nSize) {
    lVar22 = 0;
    do {
      if ((*(uint *)((long)pVVar11->pArray[lVar22] + 0x14) & 0xf) == 8) {
        *(undefined8 *)((long)pVVar11->pArray[lVar22] + 0x38) = 3;
      }
      lVar22 = lVar22 + 1;
      pVVar11 = pNtk_00->vBoxes;
    } while (lVar22 < pVVar11->nSize);
  }
  goto LAB_004741d3;
}

Assistant:

Abc_Ntk_t *
Abc_FlowRetime_MinReg( Abc_Ntk_t * pNtk, int fVerbose, 
                       int fComputeInitState, int fGuaranteeInitState, int fBlockConst,
                       int fForwardOnly, int fBackwardOnly, int nMaxIters,
                       int maxDelay, int fFastButConservative ) {

  int i;
  Abc_Obj_t   *pObj, *pNext;
  InitConstraint_t *pData;

  // create manager
  pManMR = ABC_ALLOC( MinRegMan_t, 1 );

  pManMR->pNtk = pNtk;
  pManMR->fVerbose = fVerbose;
  pManMR->fComputeInitState = fComputeInitState;
  pManMR->fGuaranteeInitState = fGuaranteeInitState;
  pManMR->fBlockConst = fBlockConst;
  pManMR->fForwardOnly = fForwardOnly;
  pManMR->fBackwardOnly = fBackwardOnly;
  pManMR->nMaxIters = nMaxIters;
  pManMR->maxDelay = maxDelay;
  pManMR->fComputeInitState = fComputeInitState;
  pManMR->fConservTimingOnly = fFastButConservative;
  pManMR->vNodes = Vec_PtrAlloc(100);
  pManMR->vInitConstraints = Vec_PtrAlloc(2);
  pManMR->pInitNtk = NULL;
  pManMR->pInitToOrig = NULL;
  pManMR->sizeInitToOrig = 0;

  vprintf("Flow-based minimum-register retiming...\n");  

  if (!Abc_NtkHasOnlyLatchBoxes(pNtk)) {
    printf("\tERROR: Can not retime with black/white boxes\n");
    return pNtk;
  }

  if (maxDelay) {
    vprintf("\tmax delay constraint = %d\n", maxDelay);
    if (maxDelay < (i = Abc_NtkLevel(pNtk))) {
      printf("ERROR: max delay constraint (%d) must be > current max delay (%d)\n", maxDelay, i);
      return pNtk;
    }
  }

  // print info about type of network
  vprintf("\tnetlist type = ");
  if (Abc_NtkIsNetlist( pNtk )) { vprintf("netlist/"); }
  else if (Abc_NtkIsLogic( pNtk )) { vprintf("logic/"); }
  else if (Abc_NtkIsStrash( pNtk )) { vprintf("strash/"); }
  else { vprintf("***unknown***/"); }
  if (Abc_NtkHasSop( pNtk )) { vprintf("sop\n"); }
  else if (Abc_NtkHasBdd( pNtk )) { vprintf("bdd\n"); }
  else if (Abc_NtkHasAig( pNtk )) { vprintf("aig\n"); }
  else if (Abc_NtkHasMapping( pNtk )) { vprintf("mapped\n"); }
  else { vprintf("***unknown***\n"); }

  vprintf("\tinitial reg count = %d\n", Abc_NtkLatchNum(pNtk));
  vprintf("\tinitial levels = %d\n", Abc_NtkLevel(pNtk));

  // remove bubbles from latch boxes
  if (pManMR->fVerbose) Abc_FlowRetime_PrintInitStateInfo(pNtk);
  vprintf("\tpushing bubbles out of latch boxes\n");
  Abc_NtkForEachLatch( pNtk, pObj, i )
    Abc_FlowRetime_RemoveLatchBubbles(pObj);
  if (pManMR->fVerbose) Abc_FlowRetime_PrintInitStateInfo(pNtk);

  // check for box inputs/outputs
  Abc_NtkForEachLatch( pNtk, pObj, i ) {
    assert(Abc_ObjFaninNum(pObj) == 1);
    assert(Abc_ObjFanoutNum(pObj) == 1);
    assert(!Abc_ObjFaninC0(pObj));

    pNext = Abc_ObjFanin0(pObj);
    assert(Abc_ObjIsBi(pNext));
    assert(Abc_ObjFaninNum(pNext) <= 1);
    if(Abc_ObjFaninNum(pNext) == 0) // every Bi should have a fanin
      Abc_FlowRetime_AddDummyFanin( pNext );
 
    pNext = Abc_ObjFanout0(pObj);
    assert(Abc_ObjIsBo(pNext));
    assert(Abc_ObjFaninNum(pNext) == 1);
    assert(!Abc_ObjFaninC0(pNext));
  }

  pManMR->nLatches = Abc_NtkLatchNum( pNtk );
  pManMR->nNodes = Abc_NtkObjNumMax( pNtk )+1;
   
  // build histogram
  pManMR->vSinkDistHist = Vec_IntStart( pManMR->nNodes*2+10 );

  // initialize timing
  if (maxDelay)
    Abc_FlowRetime_InitTiming( pNtk );

  // create lag and Flow_Data structure
  pManMR->vLags = Vec_IntStart(pManMR->nNodes);
  memset(pManMR->vLags->pArray, 0, sizeof(int)*pManMR->nNodes);

  pManMR->pDataArray = ABC_ALLOC( Flow_Data_t, pManMR->nNodes );
  Abc_FlowRetime_ClearFlows( 1 );

  // main loop!
  pNtk = Abc_FlowRetime_MainLoop();

  // cleanup node fields
  Abc_NtkForEachObj( pNtk, pObj, i ) {
    // if not computing init state, set all latches to DC
    if (!fComputeInitState && Abc_ObjIsLatch(pObj))
      Abc_LatchSetInitDc(pObj);
  }

  // deallocate space
  ABC_FREE( pManMR->pDataArray );
  if (pManMR->pInitToOrig) ABC_FREE( pManMR->pInitToOrig );
  if (pManMR->vNodes) Vec_PtrFree(pManMR->vNodes);
  if (pManMR->vLags) Vec_IntFree(pManMR->vLags);
  if (pManMR->vSinkDistHist) Vec_IntFree(pManMR->vSinkDistHist);
  if (pManMR->maxDelay) Abc_FlowRetime_FreeTiming( pNtk );
  while( Vec_PtrSize( pManMR->vInitConstraints )) {
    pData = (InitConstraint_t*)Vec_PtrPop( pManMR->vInitConstraints );
    //assert( pData->pBiasNode );
    //Abc_NtkDeleteObj( pData->pBiasNode );
    ABC_FREE( pData->vNodes.pArray );
    ABC_FREE( pData );
  }
  ABC_FREE( pManMR->vInitConstraints );

  // restrash if necessary
  if (Abc_NtkIsStrash(pNtk)) {
    Abc_NtkReassignIds( pNtk );
    pNtk = Abc_FlowRetime_NtkSilentRestrash( pNtk, 1 );
  }
  
  vprintf("\tfinal reg count = %d\n", Abc_NtkLatchNum(pNtk));
  vprintf("\tfinal levels = %d\n", Abc_NtkLevel(pNtk));

#if defined(DEBUG_CHECK)
  Abc_NtkDoCheck( pNtk );
#endif

  // free manager
  ABC_FREE( pManMR );

  return pNtk;
}